

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O0

HanabiMove __thiscall
hanabi_learning_env::HanabiGame::PickRandomChance
          (HanabiGame *this,
          pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
          *chance_outcomes)

{
  result_type __n;
  const_reference pvVar1;
  HanabiMove HVar2;
  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_> *in_RSI;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_RDI;
  discrete_distribution<unsigned_long> dist;
  discrete_distribution<unsigned_long> *this_00;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff88;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff90;
  discrete_distribution<unsigned_long> local_48;
  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  *local_18;
  value_type local_8;
  
  local_18 = in_RSI;
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  this_00 = &local_48;
  std::discrete_distribution<unsigned_long>::
  discrete_distribution<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
            (this_00,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  __n = std::discrete_distribution<unsigned_long>::operator()(this_00,in_RDI);
  pvVar1 = std::
           vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
           ::operator[](local_18,__n);
  local_8 = *pvVar1;
  std::discrete_distribution<unsigned_long>::~discrete_distribution
            ((discrete_distribution<unsigned_long> *)0x140e23);
  HVar2.move_type_ = local_8.move_type_;
  HVar2.card_index_ = local_8.card_index_;
  HVar2.target_offset_ = local_8.target_offset_;
  HVar2.color_ = local_8.color_;
  HVar2.rank_ = local_8.rank_;
  return HVar2;
}

Assistant:

HanabiMove HanabiGame::PickRandomChance(
    const std::pair<std::vector<HanabiMove>, std::vector<double>>&
        chance_outcomes) const {
  std::discrete_distribution<std::mt19937::result_type> dist(
      chance_outcomes.second.begin(), chance_outcomes.second.end());
  return chance_outcomes.first[dist(rng_)];
}